

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_hints.h
# Opt level: O2

void __thiscall
miniros::TransportHints::TransportHints(TransportHints *this,TransportHints *param_1)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->transports_,&param_1->transports_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->options_)._M_t,&(param_1->options_)._M_t);
  return;
}

Assistant:

class MINIROS_DECL TransportHints
{
public:
  /**
   * \brief Specifies a reliable transport.  Currently this means TCP
   */
  TransportHints& reliable()
  {
    tcp();

    return *this;
  }